

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

ENetPacket * enet_packet_create(void *data,size_t dataLength,enet_uint32 flags)

{
  ENetPacket *pEVar1;
  
  if ((flags & 4) == 0) {
    pEVar1 = (ENetPacket *)(*callbacks.malloc)(dataLength + 0x30);
    if (pEVar1 == (ENetPacket *)0x0) {
LAB_00103370:
      pEVar1 = (ENetPacket *)(*callbacks.no_memory)();
      return pEVar1;
    }
    pEVar1->data = (enet_uint8 *)(pEVar1 + 1);
    if (data != (void *)0x0) {
      memcpy(pEVar1 + 1,data,dataLength);
    }
  }
  else {
    pEVar1 = (ENetPacket *)(*callbacks.malloc)(0x30);
    if (pEVar1 == (ENetPacket *)0x0) goto LAB_00103370;
    pEVar1->data = (enet_uint8 *)data;
  }
  pEVar1->referenceCount = 0;
  pEVar1->flags = flags;
  pEVar1->dataLength = dataLength;
  pEVar1->freeCallback = (ENetPacketFreeCallback)0x0;
  pEVar1->userData = (void *)0x0;
  return pEVar1;
}

Assistant:

ENetPacket *enet_packet_create(const void *data, size_t dataLength, enet_uint32 flags) {
        ENetPacket *packet;
        if (flags & ENET_PACKET_FLAG_NO_ALLOCATE) {
            packet = (ENetPacket *)enet_malloc(sizeof (ENetPacket));
            if (packet == NULL) {
                return NULL;
            }

            packet->data = (enet_uint8 *)data;
        }
        else {
            packet = (ENetPacket *)enet_malloc(sizeof (ENetPacket) + dataLength);
            if (packet == NULL) {
                return NULL;
            }

            packet->data = (enet_uint8 *)packet + sizeof(ENetPacket);

            if (data != NULL) {
                memcpy(packet->data, data, dataLength);
            }
        }

        packet->referenceCount = 0;
        packet->flags        = flags;
        packet->dataLength   = dataLength;
        packet->freeCallback = NULL;
        packet->userData     = NULL;

        return packet;
    }